

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubClient_LL_UploadToBlob_PutBlock
          (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE uploadContext,uint32_t blockNumber,
          uint8_t *dataPtr,size_t dataSize)

{
  BLOB_RESULT BVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_2;
  LOGGER_LOG p_Stack_50;
  uint httpResponseStatus;
  LOGGER_LOG l_1;
  BUFFER_HANDLE blockData;
  LOGGER_LOG l;
  size_t sStack_30;
  IOTHUB_CLIENT_RESULT result;
  size_t dataSize_local;
  uint8_t *dataPtr_local;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE pIStack_18;
  uint32_t blockNumber_local;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE uploadContext_local;
  
  sStack_30 = dataSize;
  dataSize_local = (size_t)dataPtr;
  dataPtr_local._4_4_ = blockNumber;
  pIStack_18 = uploadContext;
  if (((uploadContext == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)0x0) ||
      (dataPtr == (uint8_t *)0x0)) || (dataSize == 0)) {
    blockData = (BUFFER_HANDLE)xlogging_get_log_function();
    if (blockData != (BUFFER_HANDLE)0x0) {
      (*(code *)blockData)
                (0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                 ,"IoTHubClient_LL_UploadToBlob_PutBlock",0x3d8,1,
                 "invalid argument uploadContext=%p, dataPtr=%p, dataSize=%zu",pIStack_18,
                 dataSize_local,sStack_30);
    }
    l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
  }
  else {
    l_1 = (LOGGER_LOG)BUFFER_create(dataPtr,dataSize);
    if ((BUFFER_HANDLE)l_1 == (BUFFER_HANDLE)0x0) {
      p_Stack_50 = xlogging_get_log_function();
      if (p_Stack_50 != (LOGGER_LOG)0x0) {
        (*p_Stack_50)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                      ,"IoTHubClient_LL_UploadToBlob_PutBlock",0x3e1,1,
                      "Failed allocating buffer for Blob block data");
      }
      l._4_4_ = IOTHUB_CLIENT_ERROR;
    }
    else {
      BVar1 = Blob_PutBlock(pIStack_18->blobHttpApiHandle,pIStack_18->blobStorageRelativePath,
                            dataPtr_local._4_4_,(BUFFER_HANDLE)l_1,pIStack_18->blockIdList,
                            (uint *)((long)&l_2 + 4),(BUFFER_HANDLE)0x0);
      if (BVar1 == BLOB_OK) {
        l._4_4_ = IOTHUB_CLIENT_OK;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                    ,"IoTHubClient_LL_UploadToBlob_PutBlock",0x3ef,1,
                    "Failed uploading Blob block data");
        }
        l._4_4_ = IOTHUB_CLIENT_ERROR;
      }
      BUFFER_delete((BUFFER_HANDLE)l_1);
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClient_LL_UploadToBlob_PutBlock(IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE uploadContext, uint32_t blockNumber, const uint8_t* dataPtr, size_t dataSize)
{
    IOTHUB_CLIENT_RESULT result;

    if (uploadContext == NULL || dataPtr == NULL || dataSize == 0)
    {
        LogError("invalid argument uploadContext=%p, dataPtr=%p, dataSize=%zu", uploadContext, dataPtr, dataSize);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        BUFFER_HANDLE blockData;

        if ((blockData = BUFFER_create(dataPtr, dataSize)) == NULL)
        {
            LogError("Failed allocating buffer for Blob block data");
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            unsigned int httpResponseStatus;

            if (Blob_PutBlock(
                uploadContext->blobHttpApiHandle,
                uploadContext->blobStorageRelativePath,
                blockNumber, blockData,
                uploadContext->blockIdList,
                &httpResponseStatus, NULL) != BLOB_OK)
            {
                LogError("Failed uploading Blob block data");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = IOTHUB_CLIENT_OK;
            }

            BUFFER_delete(blockData);
        }
    }

    return result;
}